

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void testing::internal::LogWithLocation(LogSeverity severity,char *file,int line,string *message)

{
  ostream *poVar1;
  int line_00;
  string local_1e0;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream s;
  string *message_local;
  int line_local;
  char *file_local;
  LogSeverity severity_local;
  
  line_00 = (int)message;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  FormatFileLocation_abi_cxx11_(&local_1c0,(internal *)file,(char *)(ulong)(uint)line,line_00);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::str();
  Log(severity,&local_1e0,0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

GTEST_API_ void LogWithLocation(testing::internal::LogSeverity severity,
                                const char* file, int line,
                                const std::string& message) {
  ::std::ostringstream s;
  s << internal::FormatFileLocation(file, line) << " " << message
    << ::std::endl;
  Log(severity, s.str(), 0);
}